

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  AssertionInfo *in_RDX;
  AssertionInfo *in_RSI;
  
  AssertionInfo::AssertionInfo(in_RSI,in_RDX);
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)in_RSI,(AssertionResultData *)in_RDX);
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData const& data )
    :   m_info( info ),
        m_resultData( data )
    {}